

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall t_swift_generator::init_generator(t_swift_generator *this)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  int __oflag_00;
  t_program *in_RDX;
  string f_impl_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string f_decl_fullname;
  string f_impl_fullname;
  string f_decl_name;
  string module_path;
  string name;
  string module;
  string local_60;
  string out_dir;
  
  get_real_swift_module_abi_cxx11_
            (&module,(t_swift_generator *)(this->super_t_oop_generator).super_t_generator.program_,
             in_RDX);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&out_dir,this);
  std::__cxx11::string::string((string *)&module_path,(string *)&out_dir);
  std::__cxx11::string::string
            ((string *)&name,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  if ((this->namespaced_ == true) && (module._M_string_length != 0)) {
    std::operator+(&f_decl_fullname,&module_path,"/");
    std::operator+(&f_decl_name,&f_decl_fullname,&module);
    std::__cxx11::string::operator=((string *)&module_path,(string *)&f_decl_name);
    std::__cxx11::string::~string((string *)&f_decl_name);
    std::__cxx11::string::~string((string *)&f_decl_fullname);
    std::__cxx11::string::_M_assign((string *)&name);
  }
  iVar2 = mkdir(module_path._M_dataplus._M_p,0x1ff);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&f_decl_fullname,module_path._M_dataplus._M_p,(allocator *)&f_impl_name);
      std::operator+(&f_decl_name,&f_decl_fullname,": ");
      __rhs = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&f_decl_name,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  populate_reserved_words(this);
  std::operator+(&f_decl_name,&name,".swift");
  std::operator+(&f_impl_name,&module_path,"/");
  std::operator+(&f_decl_fullname,&f_impl_name,&f_decl_name);
  std::__cxx11::string::~string((string *)&f_impl_name);
  std::__cxx11::string::string
            ((string *)&f_impl_name,f_decl_fullname._M_dataplus._M_p,(allocator *)&f_impl_fullname);
  poVar1 = &this->f_decl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (poVar1,(char *)&f_impl_name,__oflag);
  std::__cxx11::string::~string((string *)&f_impl_name);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&f_impl_name,this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&f_impl_name);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_impl_name);
  swift_imports_abi_cxx11_(&f_impl_name,this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&f_impl_name);
  swift_thrift_imports_abi_cxx11_(&f_impl_fullname,this);
  poVar4 = std::operator<<(poVar4,(string *)&f_impl_fullname);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_impl_fullname);
  std::__cxx11::string::~string((string *)&f_impl_name);
  std::operator+(&f_impl_name,&name,"+Exts.swift");
  std::operator+(&local_140,&module_path,"/");
  std::operator+(&f_impl_fullname,&local_140,&f_impl_name);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string
            ((string *)&local_140,f_impl_fullname._M_dataplus._M_p,(allocator *)&local_60);
  poVar1 = &this->f_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (poVar1,(char *)&local_140,__oflag_00);
  std::__cxx11::string::~string((string *)&local_140);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_140,this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_140);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_140);
  swift_imports_abi_cxx11_(&local_140,this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_140);
  swift_thrift_imports_abi_cxx11_(&local_60,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_60);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&f_impl_fullname);
  std::__cxx11::string::~string((string *)&f_impl_name);
  std::__cxx11::string::~string((string *)&f_decl_fullname);
  std::__cxx11::string::~string((string *)&f_decl_name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&module_path);
  std::__cxx11::string::~string((string *)&out_dir);
  std::__cxx11::string::~string((string *)&module);
  return;
}

Assistant:

void t_swift_generator::init_generator() {
  // Make output directory
  string module = get_real_swift_module(program_);
  string out_dir = get_out_dir();
  string module_path = out_dir;
  string name = program_name_;
  if (namespaced_ && !module.empty()) {
    module_path = module_path + "/" + module;
    name = module;
  }
  MKDIR(module_path.c_str());

  populate_reserved_words();

  // we have a .swift declarations file...
  string f_decl_name = name + ".swift";
  string f_decl_fullname = module_path + "/" + f_decl_name;
  f_decl_.open(f_decl_fullname.c_str());

  f_decl_ << autogen_comment() << endl;

  f_decl_ << swift_imports() << swift_thrift_imports() << endl;

  // ...and a .swift implementation extensions file
  string f_impl_name = name + "+Exts.swift";
  string f_impl_fullname = module_path + "/" + f_impl_name;
  f_impl_.open(f_impl_fullname.c_str());

  f_impl_ << autogen_comment() << endl;

  f_impl_ << swift_imports() << swift_thrift_imports() << endl;

}